

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposer.h
# Opt level: O3

Link __thiscall
FixedDegreeProposer::random_new_link(FixedDegreeProposer *this,Network *network,Link old_link)

{
  pointer psVar1;
  uint uVar2;
  result_type_conflict rVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  uniform_int_distribution<unsigned_int> local_40;
  ulong local_38;
  
  uVar4 = (ulong)old_link >> 0x20;
  uVar6 = (ulong)old_link & 0xffffffff;
  psVar1 = (network->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var9 = &psVar1[uVar6]._M_t._M_impl.super__Rb_tree_header;
  local_38 = uVar6;
  while( true ) {
    p_Var7 = *(_Base_ptr *)((long)&psVar1[uVar6]._M_t._M_impl.super__Rb_tree_header + 8);
    uVar2 = (uint)uVar4;
    p_Var5 = &p_Var9->_M_header;
    p_Var8 = p_Var9;
    if (p_Var7 != (_Base_ptr)0x0) {
      do {
        bVar10 = (uint)*(size_t *)(p_Var7 + 1) < uVar2;
        if (!bVar10) {
          p_Var5 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[bVar10];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 != p_Var9) &&
         (p_Var8 = (_Rb_tree_header *)p_Var5,
         uVar2 < (uint)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var8 = p_Var9;
      }
    }
    if ((p_Var8 == p_Var9) && (uVar2 != old_link.first)) break;
    local_40._M_param._M_b =
         (int)((ulong)((long)(network->node_list).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(network->node_list).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) - 1;
    local_40._M_param._M_a = 0;
    rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                      (&local_40,&this->rng->generator,&local_40._M_param);
    uVar4 = (ulong)rVar3;
  }
  return (Link)((uVar4 << 0x20) + local_38);
}

Assistant:

Link random_new_link(Network const& network, Link old_link) const {
        Link new_link(old_link);

        std::set<unsigned int> const& list = network.get_links(new_link.first);
        while (list.count(new_link.second) != 0 or new_link.second == new_link.first) {
            new_link.second = rng.R(0, network.getN());
        }

        return new_link;
    }